

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O3

int duckdb_lz4::LZ4_compress_fast_extState
              (void *state,char *source,char *dest,int inputSize,int maxOutputSize,int acceleration)

{
  int acceleration_00;
  int iVar1;
  limitedOutput_directive outputDirective;
  tableType_t tableType;
  
  iVar1 = 0;
  if (((ulong)state & 7) == 0 && state != (void *)0x0) {
    switchD_005681f0::default(state,0,0x4020);
  }
  else {
    state = (LZ4_stream_t_internal *)0x0;
  }
  acceleration_00 = 1;
  if (1 < acceleration) {
    acceleration_00 = acceleration;
  }
  if (0x10000 < acceleration_00) {
    acceleration_00 = 0x10001;
  }
  if ((uint)inputSize < 0x7e000001) {
    iVar1 = (uint)((ulong)(uint)inputSize * 0x8080808081 >> 0x27) + 0x10;
  }
  if (maxOutputSize < iVar1) {
    if (inputSize < 0x1000b) {
      tableType = byU16;
    }
    else {
      tableType = byU32;
    }
    outputDirective = limitedOutput;
  }
  else {
    if (inputSize < 0x1000b) {
      tableType = byU16;
    }
    else {
      tableType = byU32;
    }
    maxOutputSize = 0;
    outputDirective = notLimited;
  }
  iVar1 = LZ4_compress_generic
                    ((LZ4_stream_t_internal *)state,source,dest,inputSize,(int *)0x0,maxOutputSize,
                     outputDirective,tableType,noDict,noDictIssue,acceleration_00);
  return iVar1;
}

Assistant:

int LZ4_compress_fast_extState(void* state, const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t_internal* const ctx = & LZ4_initStream(state, sizeof(LZ4_stream_t)) -> internal_donotuse;
    assert(ctx != NULL);
    if (acceleration < 1) acceleration = LZ4_ACCELERATION_DEFAULT;
    if (acceleration > LZ4_ACCELERATION_MAX) acceleration = LZ4_ACCELERATION_MAX;
    if (maxOutputSize >= LZ4_compressBound(inputSize)) {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
        }
    } else {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, noDict, noDictIssue, acceleration);
        }
    }
}